

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O1

void add_stone_to_lookup(event_path_data evp,int stone_num,int global_stone_num)

{
  lookup_table_elem *plVar1;
  long lVar2;
  
  lVar2 = (long)evp->stone_lookup_table_size;
  if (lVar2 == 0) {
    plVar1 = (lookup_table_elem *)INT_CMmalloc(8);
  }
  else {
    plVar1 = (lookup_table_elem *)INT_CMrealloc(evp->stone_lookup_table,lVar2 * 8 + 8);
  }
  evp->stone_lookup_table = plVar1;
  plVar1 = evp->stone_lookup_table;
  plVar1[lVar2].global_id = global_stone_num;
  plVar1[lVar2].local_id = stone_num;
  evp->stone_lookup_table_size = evp->stone_lookup_table_size + 1;
  return;
}

Assistant:

extern void
add_stone_to_lookup(event_path_data evp, int stone_num, int global_stone_num)
{
    int base = evp->stone_lookup_table_size;
    if (evp->stone_lookup_table_size == 0) {
	evp->stone_lookup_table = 
	    malloc(sizeof(evp->stone_lookup_table[0]));
    } else {
	evp->stone_lookup_table = 
	    realloc(evp->stone_lookup_table,
		    sizeof(evp->stone_lookup_table[0]) * (1+base));
    }
    evp->stone_lookup_table[base].global_id = global_stone_num;
    evp->stone_lookup_table[base].local_id = stone_num;
    evp->stone_lookup_table_size++;
}